

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O1

int Kit_TruthBooleanDiffCount(uint *pTruth,int nVars,int iVar)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  uint *puVar7;
  ulong uVar8;
  int iVar9;
  
  uVar1 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar1 = 1;
  }
  uVar5 = (ulong)uVar1;
  if (iVar < nVars) {
    switch(iVar) {
    case 0:
      if (0 < (int)uVar1) {
        uVar8 = 0;
        iVar6 = 0;
        do {
          uVar1 = pTruth[uVar8] >> 1 ^ pTruth[uVar8];
          uVar1 = (uVar1 >> 2 & 0x11111111) + (uVar1 & 0x11111111);
          uVar1 = (uVar1 >> 4 & 0x3030303) + (uVar1 & 0x3030303);
          uVar1 = (uVar1 >> 8 & 0x70007) + (uVar1 & 0x70007);
          iVar6 = (uVar1 >> 0x10) + iVar6 + (uVar1 & 0xffff);
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
        return iVar6;
      }
      break;
    case 1:
      if (0 < (int)uVar1) {
        uVar8 = 0;
        iVar6 = 0;
        do {
          uVar1 = pTruth[uVar8] >> 2 ^ pTruth[uVar8];
          uVar1 = (uVar1 >> 1 & 0x11111111) + (uVar1 & 0x11111111);
          uVar1 = (uVar1 >> 4 & 0x3030303) + (uVar1 & 0x3030303);
          uVar1 = (uVar1 >> 8 & 0x70007) + (uVar1 & 0x70007);
          iVar6 = (uVar1 >> 0x10) + iVar6 + (uVar1 & 0xffff);
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
        return iVar6;
      }
      break;
    case 2:
      if (0 < (int)uVar1) {
        uVar8 = 0;
        iVar6 = 0;
        do {
          uVar1 = pTruth[uVar8] >> 4 ^ pTruth[uVar8];
          uVar1 = (uVar1 >> 1 & 0x5050505) + (uVar1 & 0x5050505);
          uVar1 = (uVar1 >> 2 & 0x3030303) + (uVar1 & 0x3030303);
          uVar1 = (uVar1 >> 8 & 0x70007) + (uVar1 & 0x70007);
          iVar6 = (uVar1 >> 0x10) + iVar6 + (uVar1 & 0xffff);
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
        return iVar6;
      }
      break;
    case 3:
      if (0 < (int)uVar1) {
        uVar8 = 0;
        iVar6 = 0;
        do {
          uVar1 = pTruth[uVar8] >> 8 ^ pTruth[uVar8];
          uVar1 = (uVar1 >> 1 & 0x550055) + (uVar1 & 0x550055);
          uVar1 = (uVar1 >> 2 & 0x330033) + (uVar1 & 0x330033);
          uVar1 = (uVar1 >> 4 & 0x70007) + (uVar1 & 0x70007);
          iVar6 = (uVar1 >> 0x10) + iVar6 + (uVar1 & 0xffff);
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
        return iVar6;
      }
      break;
    case 4:
      if (0 < (int)uVar1) {
        uVar8 = 0;
        iVar6 = 0;
        do {
          uVar1 = pTruth[uVar8] >> 0x10 ^ pTruth[uVar8];
          uVar1 = (uVar1 >> 1 & 0x5555) + (uVar1 & 0x5555);
          uVar1 = (uVar1 >> 2 & 0x3333) + (uVar1 & 0x3333);
          uVar1 = (uVar1 >> 4 & 0x707) + (uVar1 & 0x707);
          iVar6 = (uVar1 >> 8) + (uVar1 & 0xff) + iVar6;
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
        return iVar6;
      }
      break;
    default:
      if (0 < (int)uVar1) {
        bVar4 = (byte)(iVar + -5);
        uVar2 = 1 << (bVar4 & 0x1f);
        iVar6 = 2 << (bVar4 & 0x1f);
        uVar5 = 1;
        if (1 < (int)uVar2) {
          uVar5 = (ulong)uVar2;
        }
        puVar7 = pTruth + (int)uVar2;
        iVar3 = 0;
        iVar9 = 0;
        do {
          if (iVar + -5 != 0x1f) {
            uVar8 = 0;
            do {
              uVar2 = ((puVar7[uVar8] ^ pTruth[uVar8]) >> 1 & 0x55555555) +
                      ((puVar7[uVar8] ^ pTruth[uVar8]) & 0x55555555);
              uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
              uVar2 = (uVar2 >> 4 & 0x7070707) + (uVar2 & 0x7070707);
              uVar2 = (uVar2 >> 8 & 0xf000f) + (uVar2 & 0xf000f);
              iVar3 = (uVar2 >> 0x10) + iVar3 + (uVar2 & 0xffff);
              uVar8 = uVar8 + 1;
            } while (uVar5 != uVar8);
          }
          iVar9 = iVar9 + iVar6;
          puVar7 = puVar7 + iVar6;
          pTruth = pTruth + iVar6;
        } while (iVar9 < (int)uVar1);
        return iVar3;
      }
    }
    return 0;
  }
  __assert_fail("iVar < nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitTruth.c"
                ,0x3d6,"int Kit_TruthBooleanDiffCount(unsigned int *, int, int)");
}

Assistant:

int Kit_TruthBooleanDiffCount( unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step, Counter = 0;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes( (pTruth[i] ^ (pTruth[i] >> 1)) & 0x55555555 );
        return Counter;
    case 1:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes( (pTruth[i] ^ (pTruth[i] >> 2)) & 0x33333333 );
        return Counter;
    case 2:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes( (pTruth[i] ^ (pTruth[i] >> 4)) & 0x0F0F0F0F );
        return Counter;
    case 3:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes( (pTruth[i] ^ (pTruth[i] >> 8)) & 0x00FF00FF );
        return Counter;
    case 4:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes( (pTruth[i] ^ (pTruth[i] >>16)) & 0x0000FFFF );
        return Counter;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                Counter += Kit_WordCountOnes( pTruth[i] ^ pTruth[Step+i] );
            pTruth += 2*Step;
        }
        return Counter;
    }
}